

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread.c
# Opt level: O3

void tls_thread(void *arg)

{
  int *piVar1;
  uv_buf_t *puVar2;
  int iVar3;
  void *pvVar4;
  void *extraout_RAX;
  pthread_t __th;
  long lVar5;
  addrinfo *ai;
  uv_loop_t *puVar6;
  undefined1 *puVar7;
  uv_fs_t *req;
  undefined1 auStack_110 [104];
  Elf64_Ehdr *pEStack_a8;
  uv_loop_t *puStack_a0;
  size_t sStack_98;
  rlim64_t rStack_90;
  size_t sStack_88;
  rlimit64 rStack_80;
  pthread_attr_t pStack_70;
  code *pcStack_38;
  void *pvStack_30;
  undefined1 auStack_28 [8];
  uv_thread_t auStack_20 [2];
  
  auStack_20[0] = 0x1cf477;
  pvVar4 = uv_key_get(&tls_key);
  if (pvVar4 != (void *)0x0) {
    auStack_20[0] = 0x1cf4c9;
    tls_thread_cold_1();
    auStack_20[0] = (uv_thread_t)extraout_RAX;
LAB_001cf4c9:
    auStack_28 = (undefined1  [8])0x1f52c5;
    pcStack_38 = (code *)0x209468;
    pStack_70._48_8_ = 0x1cf50c;
    pvStack_30 = arg;
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread.c"
            ,0xc3,"arg");
    auStack_20[0] = 0x1cf515;
    abort();
  }
  auStack_20[0] = 0x1cf48e;
  uv_key_set(&tls_key,arg);
  auStack_20[0] = 0x1cf496;
  auStack_20[0] = (uv_thread_t)uv_key_get(&tls_key);
  if ((void *)auStack_20[0] != arg) goto LAB_001cf4c9;
  auStack_20[0] = 0x1cf4ac;
  uv_key_set(&tls_key,(void *)0x0);
  auStack_20[0] = 0x1cf4b4;
  pvVar4 = uv_key_get(&tls_key);
  if (pvVar4 == (void *)0x0) {
    return;
  }
  auStack_20[0] = (uv_thread_t)run_test_thread_stack_size;
  tls_thread_cold_2();
  pcStack_38 = (code *)0x1cf534;
  iVar3 = uv_thread_create(auStack_20,thread_check_stack,(void *)0x0);
  auStack_28 = (undefined1  [8])(long)iVar3;
  pvStack_30 = (void *)0x0;
  if (auStack_28 == (undefined1  [8])0x0) {
    pcStack_38 = (code *)0x1cf558;
    iVar3 = uv_thread_join(auStack_20);
    auStack_28 = (undefined1  [8])(long)iVar3;
    pvStack_30 = (void *)0x0;
    if (auStack_28 == (undefined1  [8])0x0) {
      return;
    }
  }
  else {
    pcStack_38 = (code *)0x1cf586;
    run_test_thread_stack_size_cold_1();
  }
  puVar6 = (uv_loop_t *)auStack_28;
  pcStack_38 = thread_check_stack;
  run_test_thread_stack_size_cold_2();
  pcStack_38 = (code *)&tls_key;
  puStack_a0 = (uv_loop_t *)0x1cf5aa;
  iVar3 = getrlimit64(RLIMIT_STACK,&rStack_80);
  pStack_70.__align = (long)iVar3;
  sStack_88 = 0;
  if (pStack_70.__align == 0) {
    if (rStack_80.rlim_cur == 0xffffffffffffffff) {
      rStack_80.rlim_cur = 0x200000;
    }
    puStack_a0 = (uv_loop_t *)0x1cf5e0;
    __th = pthread_self();
    puStack_a0 = (uv_loop_t *)0x1cf5ed;
    iVar3 = pthread_getattr_np(__th,&pStack_70);
    sStack_88 = (size_t)iVar3;
    sStack_98 = 0;
    if (sStack_88 != 0) goto LAB_001cf699;
    puStack_a0 = (uv_loop_t *)0x1cf61a;
    iVar3 = pthread_attr_getstacksize(&pStack_70,&sStack_88);
    sStack_98 = (size_t)iVar3;
    rStack_90 = 0;
    if (sStack_98 != 0) goto LAB_001cf6a6;
    if ((puVar6 == (uv_loop_t *)0x0) ||
       (rStack_90 = *(rlim64_t *)&puVar6->active_handles, *(rlim64_t *)&puVar6->active_handles == 0)
       ) {
      rStack_90 = rStack_80.rlim_cur;
    }
    sStack_98 = sStack_88;
    if ((long)sStack_88 < (long)rStack_90) goto LAB_001cf6b3;
    puStack_a0 = (uv_loop_t *)0x1cf66a;
    iVar3 = pthread_attr_destroy(&pStack_70);
    sStack_98 = (size_t)iVar3;
    rStack_90 = 0;
    if (sStack_98 == 0) {
      return;
    }
  }
  else {
    puStack_a0 = (uv_loop_t *)0x1cf699;
    thread_check_stack_cold_1();
LAB_001cf699:
    puStack_a0 = (uv_loop_t *)0x1cf6a6;
    thread_check_stack_cold_2();
LAB_001cf6a6:
    puStack_a0 = (uv_loop_t *)0x1cf6b3;
    thread_check_stack_cold_3();
LAB_001cf6b3:
    puStack_a0 = (uv_loop_t *)0x1cf6c0;
    thread_check_stack_cold_5();
  }
  puStack_a0 = (uv_loop_t *)run_test_thread_stack_size_explicit;
  thread_check_stack_cold_4();
  auStack_110._96_4_ = 1;
  pEStack_a8 = &Elf64_Ehdr_00100000;
  auStack_110._56_8_ = (void *)0x1cf6f9;
  puStack_a0 = puVar6;
  iVar3 = uv_thread_create_ex((uv_thread_t *)(auStack_110 + 0x58),
                              (uv_thread_options_t *)(auStack_110 + 0x60),thread_check_stack,
                              (uv_thread_options_t *)(auStack_110 + 0x60));
  auStack_110._80_8_ = SEXT48(iVar3);
  auStack_110._72_8_ = 0;
  if ((uv_fs_cb)auStack_110._80_8_ == (uv_fs_cb)0x0) {
    auStack_110._56_8_ = (void *)0x1cf723;
    iVar3 = uv_thread_join((uv_thread_t *)(auStack_110 + 0x58));
    auStack_110._80_8_ = SEXT48(iVar3);
    auStack_110._72_8_ = 0;
    if ((uv_fs_cb)auStack_110._80_8_ != (uv_fs_cb)0x0) goto LAB_001cf9f7;
    pEStack_a8 = (Elf64_Ehdr *)(data + 0x4441a0);
    auStack_110._56_8_ = (void *)0x1cf764;
    iVar3 = uv_thread_create_ex((uv_thread_t *)(auStack_110 + 0x58),
                                (uv_thread_options_t *)(auStack_110 + 0x60),thread_check_stack,
                                (uv_thread_options_t *)(auStack_110 + 0x60));
    auStack_110._80_8_ = SEXT48(iVar3);
    auStack_110._72_8_ = 0;
    if ((uv_fs_cb)auStack_110._80_8_ != (uv_fs_cb)0x0) goto LAB_001cfa06;
    auStack_110._56_8_ = (void *)0x1cf78e;
    iVar3 = uv_thread_join((uv_thread_t *)(auStack_110 + 0x58));
    auStack_110._80_8_ = SEXT48(iVar3);
    auStack_110._72_8_ = 0;
    if ((uv_fs_cb)auStack_110._80_8_ != (uv_fs_cb)0x0) goto LAB_001cfa15;
    puVar6 = (uv_loop_t *)0x0;
    pEStack_a8 = (Elf64_Ehdr *)0x0;
    auStack_110._56_8_ = (void *)0x1cf7cd;
    iVar3 = uv_thread_create_ex((uv_thread_t *)(auStack_110 + 0x58),
                                (uv_thread_options_t *)(auStack_110 + 0x60),thread_check_stack,
                                (uv_thread_options_t *)(auStack_110 + 0x60));
    auStack_110._80_8_ = SEXT48(iVar3);
    auStack_110._72_8_ = 0;
    if ((uv_fs_cb)auStack_110._80_8_ != (uv_fs_cb)0x0) goto LAB_001cfa24;
    auStack_110._56_8_ = (void *)0x1cf7f3;
    iVar3 = uv_thread_join((uv_thread_t *)(auStack_110 + 0x58));
    auStack_110._80_8_ = SEXT48(iVar3);
    auStack_110._72_8_ = 0;
    if ((uv_fs_cb)auStack_110._80_8_ != (uv_fs_cb)0x0) goto LAB_001cfa33;
    pEStack_a8 = (Elf64_Ehdr *)0x2a;
    auStack_110._56_8_ = (void *)0x1cf834;
    iVar3 = uv_thread_create_ex((uv_thread_t *)(auStack_110 + 0x58),
                                (uv_thread_options_t *)(auStack_110 + 0x60),thread_check_stack,
                                (uv_thread_options_t *)(auStack_110 + 0x60));
    auStack_110._80_8_ = SEXT48(iVar3);
    auStack_110._72_8_ = 0;
    if ((uv_fs_cb)auStack_110._80_8_ != (uv_fs_cb)0x0) goto LAB_001cfa42;
    auStack_110._56_8_ = (void *)0x1cf85e;
    iVar3 = uv_thread_join((uv_thread_t *)(auStack_110 + 0x58));
    auStack_110._80_8_ = SEXT48(iVar3);
    auStack_110._72_8_ = 0;
    if ((uv_fs_cb)auStack_110._80_8_ != (uv_fs_cb)0x0) goto LAB_001cfa51;
    auStack_110._56_8_ = (void *)0x1cf888;
    lVar5 = __sysconf(0x4b);
    pEStack_a8 = (Elf64_Ehdr *)(lVar5 + -0x2a);
    auStack_110._56_8_ = (void *)0x1cf8a9;
    iVar3 = uv_thread_create_ex((uv_thread_t *)(auStack_110 + 0x58),
                                (uv_thread_options_t *)(auStack_110 + 0x60),thread_check_stack,
                                (uv_thread_options_t *)(auStack_110 + 0x60));
    auStack_110._80_8_ = SEXT48(iVar3);
    auStack_110._72_8_ = 0;
    if ((uv_fs_cb)auStack_110._80_8_ != (uv_fs_cb)0x0) goto LAB_001cfa60;
    auStack_110._56_8_ = (void *)0x1cf8d3;
    iVar3 = uv_thread_join((uv_thread_t *)(auStack_110 + 0x58));
    auStack_110._80_8_ = SEXT48(iVar3);
    auStack_110._72_8_ = 0;
    if ((uv_fs_cb)auStack_110._80_8_ != (uv_fs_cb)0x0) goto LAB_001cfa6f;
    auStack_110._56_8_ = (void *)0x1cf8fd;
    lVar5 = __sysconf(0x4b);
    pEStack_a8 = (Elf64_Ehdr *)(lVar5 / 2 + -0x2a);
    auStack_110._56_8_ = (void *)0x1cf92b;
    iVar3 = uv_thread_create_ex((uv_thread_t *)(auStack_110 + 0x58),
                                (uv_thread_options_t *)(auStack_110 + 0x60),thread_check_stack,
                                (uv_thread_options_t *)(auStack_110 + 0x60));
    auStack_110._80_8_ = SEXT48(iVar3);
    auStack_110._72_8_ = 0;
    if ((uv_fs_cb)auStack_110._80_8_ != (uv_fs_cb)0x0) goto LAB_001cfa7e;
    auStack_110._56_8_ = (void *)0x1cf955;
    iVar3 = uv_thread_join((uv_thread_t *)(auStack_110 + 0x58));
    auStack_110._80_8_ = SEXT48(iVar3);
    auStack_110._72_8_ = 0;
    if ((uv_fs_cb)auStack_110._80_8_ != (uv_fs_cb)0x0) goto LAB_001cfa8d;
    pEStack_a8 = (Elf64_Ehdr *)0x12d687;
    auStack_110._56_8_ = (void *)0x1cf996;
    iVar3 = uv_thread_create_ex((uv_thread_t *)(auStack_110 + 0x58),
                                (uv_thread_options_t *)(auStack_110 + 0x60),thread_check_stack,
                                (uv_thread_options_t *)(auStack_110 + 0x60));
    auStack_110._80_8_ = SEXT48(iVar3);
    auStack_110._72_8_ = 0;
    if ((uv_fs_cb)auStack_110._80_8_ == (uv_fs_cb)0x0) {
      auStack_110._56_8_ = (void *)0x1cf9c0;
      iVar3 = uv_thread_join((uv_thread_t *)(auStack_110 + 0x58));
      auStack_110._80_8_ = SEXT48(iVar3);
      auStack_110._72_8_ = 0;
      if ((uv_fs_cb)auStack_110._80_8_ == (uv_fs_cb)0x0) {
        return;
      }
      goto LAB_001cfaab;
    }
  }
  else {
    auStack_110._56_8_ = (void *)0x1cf9f7;
    run_test_thread_stack_size_explicit_cold_1();
LAB_001cf9f7:
    auStack_110._56_8_ = (void *)0x1cfa06;
    run_test_thread_stack_size_explicit_cold_2();
LAB_001cfa06:
    auStack_110._56_8_ = (void *)0x1cfa15;
    run_test_thread_stack_size_explicit_cold_3();
LAB_001cfa15:
    auStack_110._56_8_ = (void *)0x1cfa24;
    run_test_thread_stack_size_explicit_cold_4();
LAB_001cfa24:
    auStack_110._56_8_ = (void *)0x1cfa33;
    run_test_thread_stack_size_explicit_cold_5();
LAB_001cfa33:
    auStack_110._56_8_ = (void *)0x1cfa42;
    run_test_thread_stack_size_explicit_cold_6();
LAB_001cfa42:
    auStack_110._56_8_ = (void *)0x1cfa51;
    run_test_thread_stack_size_explicit_cold_7();
LAB_001cfa51:
    auStack_110._56_8_ = (void *)0x1cfa60;
    run_test_thread_stack_size_explicit_cold_8();
LAB_001cfa60:
    auStack_110._56_8_ = (void *)0x1cfa6f;
    run_test_thread_stack_size_explicit_cold_9();
LAB_001cfa6f:
    auStack_110._56_8_ = (void *)0x1cfa7e;
    run_test_thread_stack_size_explicit_cold_10();
LAB_001cfa7e:
    auStack_110._56_8_ = (void *)0x1cfa8d;
    run_test_thread_stack_size_explicit_cold_11();
LAB_001cfa8d:
    auStack_110._56_8_ = (void *)0x1cfa9c;
    run_test_thread_stack_size_explicit_cold_12();
  }
  auStack_110._56_8_ = (void *)0x1cfaab;
  run_test_thread_stack_size_explicit_cold_13();
LAB_001cfaab:
  puVar7 = auStack_110 + 0x50;
  auStack_110._56_8_ = getaddrinfo_do;
  run_test_thread_stack_size_explicit_cold_14();
  auStack_110._32_8_ = (void *)0x1cfae2;
  iVar3 = uv_getaddrinfo(*(uv_loop_t **)(puVar7 + 0x10),(uv_getaddrinfo_t *)(puVar7 + 0x18),
                         getaddrinfo_cb,"localhost",(char *)0x0,(addrinfo *)0x0);
  auStack_110._56_8_ = SEXT48(iVar3);
  auStack_110._48_8_ = (void *)0x0;
  if ((void *)auStack_110._56_8_ == (void *)0x0) {
    return;
  }
  puVar7 = auStack_110 + 0x38;
  auStack_110._32_8_ = fs_do;
  getaddrinfo_do_cold_1();
  auStack_110._8_8_ = (uv_loop_t *)0x1cfb34;
  iVar3 = uv_fs_stat(*(uv_loop_t **)(puVar7 + 0x10),(uv_fs_t *)(puVar7 + 0x18),".",fs_cb);
  auStack_110._32_8_ = SEXT48(iVar3);
  auStack_110._24_8_ = (void *)0x0;
  if ((void *)auStack_110._32_8_ == (void *)0x0) {
    return;
  }
  puVar7 = auStack_110 + 0x20;
  iVar3 = (int)auStack_110 + 0x18;
  auStack_110._8_8_ = getaddrinfo_cb;
  fs_do_cold_1();
  auStack_110._0_8_ = SEXT48(iVar3);
  auStack_110._8_8_ = puVar6;
  if ((void *)auStack_110._0_8_ != (void *)0x0) {
    req = (uv_fs_t *)auStack_110;
    getaddrinfo_cb_cold_1();
    uv_fs_req_cleanup(req);
    puVar2 = req[-1].bufsml + 3;
    *(int *)&puVar2->base = *(int *)&puVar2->base + -1;
    if (*(int *)&puVar2->base != 0) {
      fs_do((fs_req *)&req[-1].bufsml[2].len);
      return;
    }
    return;
  }
  uv_freeaddrinfo(ai);
  piVar1 = (int *)(puVar7 + -0x10);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    getaddrinfo_do((getaddrinfo_req *)(puVar7 + -0x18));
    return;
  }
  return;
}

Assistant:

static void tls_thread(void* arg) {
  ASSERT_NULL(uv_key_get(&tls_key));
  uv_key_set(&tls_key, arg);
  ASSERT_PTR_EQ(arg, uv_key_get(&tls_key));
  uv_key_set(&tls_key, NULL);
  ASSERT_NULL(uv_key_get(&tls_key));
}